

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

int login(string *cmd,int socket_fd,string *currUser,
         vector<cUser,_std::allocator<cUser>_> *currUsers,int id,bool *msgFlags,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *msgs)

{
  anon_struct_40_2_6a8bb0e8 *paVar1;
  pointer paVar2;
  pointer paVar3;
  bool bVar4;
  ssize_t sVar5;
  ostream *poVar6;
  int iVar7;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> _Var8;
  long lVar9;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it;
  long lVar10;
  pointer paVar11;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> __it_00;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> _Var12;
  undefined1 local_1d8 [64];
  string local_198 [32];
  anon_class_64_2_84df61a8_for__M_pred local_178;
  size_type *local_138;
  string password;
  string username;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [3];
  undefined1 local_b8 [8];
  vector<User,_std::allocator<User>_> users;
  undefined1 local_88 [8];
  cUser user;
  vector<cUser,_std::allocator<cUser>_> *__range3;
  
  password.field_2._8_8_ = &username._M_string_length;
  username._M_dataplus._M_p = (pointer)0x0;
  username._M_string_length._0_1_ = 0;
  local_138 = &password._M_string_length;
  password._M_dataplus._M_p = (pointer)0x0;
  password._M_string_length._0_1_ = 0;
  users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)msgFlags;
  getUsers();
  std::__cxx11::string::find((char *)cmd,0x1091c9);
  std::__cxx11::string::substr((ulong)local_88,(ulong)cmd);
  std::__cxx11::string::operator=((string *)(password.field_2._M_local_buf + 8),(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::substr((ulong)local_88,(ulong)cmd);
  std::__cxx11::string::operator=((string *)&local_138,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  paVar3 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
           _M_start;
  std::__cxx11::string::string((string *)local_1d8,(string *)(password.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(local_1d8 + 0x20),(string *)&local_138);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::__0((__0 *)(username.field_2._M_local_buf + 8),
             (anon_class_64_2_84df61a8_for__M_pred *)local_1d8);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::__0((__0 *)local_88,(anon_class_64_2_84df61a8_for__M_pred *)((long)&username.field_2 + 8));
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::__0((__0 *)&local_178,(anon_class_64_2_84df61a8_for__M_pred *)local_88);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::~__0((__0 *)local_88);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::__0((__0 *)local_88,&local_178);
  lVar9 = (long)paVar3 - (long)local_b8;
  __it_00._M_current = (anon_struct_64_2_84df61a8 *)local_b8;
  for (lVar10 = lVar9 >> 8; _Var8._M_current = __it_00._M_current, 0 < lVar10; lVar10 = lVar10 + -1)
  {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_88,__it_00);
    if (bVar4) goto LAB_001065ed;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_88,__it_00._M_current + 1);
    _Var8._M_current = __it_00._M_current + 1;
    if (bVar4) goto LAB_001065ed;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_88,__it_00._M_current + 2);
    _Var8._M_current = __it_00._M_current + 2;
    if (bVar4) goto LAB_001065ed;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_88,__it_00._M_current + 3);
    _Var8._M_current = __it_00._M_current + 3;
    if (bVar4) goto LAB_001065ed;
    __it_00._M_current = __it_00._M_current + 4;
    lVar9 = lVar9 + -0x100;
  }
  lVar9 = lVar9 >> 6;
  if (lVar9 == 1) {
LAB_001065db:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_88,__it_00);
    _Var8._M_current = paVar3;
    if (bVar4) {
      _Var8._M_current = __it_00._M_current;
    }
  }
  else if (lVar9 == 2) {
LAB_001065b6:
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_88,_Var8);
    if (!bVar4) {
      __it_00._M_current = _Var8._M_current + 1;
      goto LAB_001065db;
    }
  }
  else {
    _Var8._M_current = paVar3;
    if ((lVar9 == 3) &&
       (bVar4 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                              *)local_88,__it_00), _Var8._M_current = __it_00._M_current, !bVar4)) {
      _Var8._M_current = __it_00._M_current + 1;
      goto LAB_001065b6;
    }
  }
LAB_001065ed:
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::~__0((__0 *)local_88);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::~__0((__0 *)&local_178);
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::~__0((__0 *)(username.field_2._M_local_buf + 8));
  login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
  ::$_0::~__0((__0 *)local_1d8);
  if (_Var8._M_current !=
      users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    __it._M_current =
         (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
         super__Vector_impl_data._M_start;
    paVar1 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::__cxx11::string::string(local_198,(string *)(password.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(username.field_2._M_local_buf + 8),local_198);
    local_88 = (undefined1  [8])&user.username._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)username.field_2._8_8_ == local_e8) {
      user.username.field_2._M_allocated_capacity = local_e8[0]._8_8_;
      username.field_2._8_8_ = local_88;
    }
    local_e8[0]._M_local_buf[0] = '\0';
    local_178.username._M_dataplus._M_p = (pointer)username.field_2._8_8_;
    if ((undefined1  [8])username.field_2._8_8_ == local_88) {
      local_178.username.field_2._8_8_ = user.username.field_2._M_allocated_capacity;
      local_178.username._M_dataplus._M_p = (pointer)&local_178.username.field_2;
    }
    user.username._M_dataplus._M_p = (pointer)0x0;
    user.username._M_string_length = (ulong)(uint7)local_e8[0]._1_7_ << 8;
    username.field_2._8_8_ = local_e8;
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::string((string *)local_88,(string *)&local_178);
    lVar9 = (long)paVar1 - (long)__it._M_current;
    for (lVar10 = lVar9 / 0x28 >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_88,__it);
      _Var12._M_current = __it._M_current;
      if (bVar4) goto LAB_001067eb;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_88,__it._M_current + 1);
      _Var12._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_001067eb;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_88,__it._M_current + 2);
      _Var12._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_001067eb;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_88,__it._M_current + 3);
      _Var12._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_001067eb;
      __it._M_current = __it._M_current + 4;
      lVar9 = lVar9 + -0xa0;
    }
    lVar9 = lVar9 / 0x28;
    if (lVar9 == 1) {
LAB_001067d9:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_88,__it);
      _Var12._M_current = paVar1;
      if (bVar4) {
        _Var12._M_current = __it._M_current;
      }
    }
    else if (lVar9 == 2) {
LAB_001067ba:
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_88,__it);
      _Var12._M_current = __it._M_current;
      if (!bVar4) {
        __it._M_current = __it._M_current + 1;
        goto LAB_001067d9;
      }
    }
    else {
      _Var12._M_current = paVar1;
      if ((lVar9 == 3) &&
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                  ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                *)local_88,__it), _Var12._M_current = __it._M_current, !bVar4)) {
        __it._M_current = __it._M_current + 1;
        goto LAB_001067ba;
      }
    }
LAB_001067eb:
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)(username.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_198);
    if (_Var12._M_current ==
        (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      sVar5 = send(socket_fd,"Login Confirmed",0x14,0);
      if (sVar5 == -1) {
        perror("send");
      }
      paVar2 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (paVar11 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                     super__Vector_impl_data._M_start; paVar11 != paVar2; paVar11 = paVar11 + 1) {
        anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_88,paVar11);
        std::operator+(&local_178.username,&(_Var8._M_current)->username," has joined");
        std::__cxx11::string::operator=
                  ((string *)
                   ((msgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + (int)user.username.field_2._8_4_),
                   (string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        *(undefined1 *)
         ((long)&((users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->username)._M_dataplus._M_p +
         (long)(int)user.username.field_2._8_4_) = 1;
        std::__cxx11::string::~string((string *)local_88);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &(_Var8._M_current)->username," Login.");
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_88);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::_M_assign((string *)currUser);
      local_88 = (undefined1  [8])&user.username._M_string_length;
      user.username._M_string_length = 0;
      user.username.field_2._M_allocated_capacity = 0;
      user.username.field_2._8_8_ = 0;
      user.username._M_dataplus._M_p = (pointer)0x0;
      std::vector<cUser,_std::allocator<cUser>_>::emplace_back<cUser>
                (currUsers,(anon_struct_40_2_6a8bb0e8 *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -1));
      (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data
      ._M_finish[-1].id = id;
      iVar7 = 1;
      goto LAB_001069aa;
    }
    sVar5 = send(socket_fd,"User is already logged in",0x1e,0);
    if (sVar5 == -1) {
      perror("user already logged in");
    }
  }
  sVar5 = send(socket_fd,"Invalid Username or Password",0x28,0);
  if (sVar5 == -1) {
    perror("send");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Invalid username or password");
  iVar7 = 0;
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_001069aa:
  std::vector<User,_std::allocator<User>_>::~vector((vector<User,_std::allocator<User>_> *)local_b8)
  ;
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)(password.field_2._M_local_buf + 8));
  return iVar7;
}

Assistant:

int login(string cmd, int socket_fd, string* currUser,vector<cUser>& currUsers,
    int id, bool* msgFlags, vector<string>& msgs){

    string username;
    string password;
    char command[MAXDATASIZE];
    int numbytes = 0;

    //get the current user's usernames and passwords from the userfile
    vector<User> users = getUsers();

    //parse the command string given to the function
    //if no sername or password this step will catch that and not error out
    size_t spacePos = cmd.find(" ");
    username = cmd.substr(0,spacePos);
    password = cmd.substr(spacePos+1);


    //search through all the users and check for usersname and password
    auto it = find_if(users.begin(),users.end(),[username,password](User u){
        return (u.username == username && u.password == password);
    });

    //if the find function found a match, then add the users name and
    // send confirmation
    if(it != users.end()){
        auto currUsersIt = find_if(currUsers.begin(),currUsers.end(),[username](cUser u){
            return (u.username == username);
        });

        //check if the user is already logged in
        if(currUsersIt == currUsers.end()){

            if(send(socket_fd, "Login Confirmed",20,0) == -1)
                perror("send");

            //broadcast the user has joined
            for(cUser user : currUsers){
                msgs[user.id] = string(it->username + " has joined");
                msgFlags[user.id] = true;
            }

            cout << it->username + " Login." << endl;

            //add evertyhing to the currently logged in users list
            *currUser = it->username;
            currUsers.push_back(cUser());
            currUsers.back().username = it->username;
            currUsers.back().id = id;

            return 1;
        }
        else{
            if(send(socket_fd, "User is already logged in",30,0) == -1)
                perror("user already logged in");
        }

    }

    //otherwise error
    if(send(socket_fd, "Invalid Username or Password",40,0) == -1)
        perror("send");
    cout << "Invalid username or password" << endl;

    return 0;

}